

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::
    make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
              (shared_ptr<cs::name_space> *args)

{
  holder<std::shared_ptr<cs::name_space>_> *args_1;
  proxy *dat;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  proxy *in_RDI;
  proxy *args_2;
  allocator_type<cs_impl::any::holder<std::shared_ptr<cs::name_space>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar2 = 1;
  uVar1 = 1;
  args_2 = in_RDI;
  args_1 = cs::
           allocator_type<cs_impl::any::holder<std::shared_ptr<cs::name_space>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::shared_ptr<cs::name_space>const&>
                     (in_stack_ffffffffffffffe0,(shared_ptr<cs::name_space> *)in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<std::shared_ptr<cs::name_space>>*>
                  (in_RSI,(int *)CONCAT44(uVar2,uVar1),(int *)args_1,
                   (holder<std::shared_ptr<cs::name_space>_> **)args_2);
  any((any *)in_RDI,dat);
  return (any)args_2;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}